

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

GenericStreamTextBasedSet * __thiscall
ASDCP::MXF::GenericStreamTextBasedSet::WriteToTLVSet
          (GenericStreamTextBasedSet *this,TLVWriter *TLVSet)

{
  MDDEntry *value;
  MDDEntry *in_RDX;
  TLVWriter local_80;
  
  if (TLVSet[1].super_MemIOWriter.m_p != (byte_t *)0x0) {
    TextBasedObject::WriteToTLVSet(&this->super_TextBasedObject,TLVSet);
    if (-1 < *(int *)&(this->super_TextBasedObject).super_DescriptiveObject.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      value = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                               MDD_GenericStreamTextBasedSet_GenericStreamSID);
      TLVWriter::WriteUi32(&local_80,in_RDX,(ui32_t *)value);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x131d,
                "virtual ASDCP::Result_t ASDCP::MXF::GenericStreamTextBasedSet::WriteToTLVSet(TLVWriter &)"
               );
}

Assistant:

ASDCP::Result_t
GenericStreamTextBasedSet::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = TextBasedObject::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(GenericStreamTextBasedSet, GenericStreamSID));
  return result;
}